

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O2

int __thiscall CTcSymProp::write_to_image_file_global(CTcSymProp *this,CVmImageWriter *image_writer)

{
  uint16_t tmp;
  tctarg_prop_id_t local_88;
  byte local_86;
  
  local_88 = (this->super_CTcSymPropBase).prop_;
  local_86 = (byte)(this->super_CTcSymPropBase).field_0x2a >> 1 & 1;
  CVmImageWriter::write_gsym_entry
            (image_writer,
             (this->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
             super_CVmHashEntry.str_,
             (this->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
             super_CVmHashEntry.len_,3,(char *)&local_88,3);
  return 1;
}

Assistant:

int CTcSymProp::write_to_image_file_global(class CVmImageWriter *image_writer)
{
    char buf[128];

    /* build our extra data buffer */
    oswp2(buf, (uint)get_prop());

    /* build our flags byte */
    buf[2] = 0;
    if (vocab_)
        buf[2] |= 0x01;

    /* write the data */
    image_writer->write_gsym_entry(get_sym(), get_sym_len(),
                                   (int)TC_SYM_PROP, buf, 3);

    /* we wrote the symbol */
    return TRUE;
}